

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O0

bool ReadFile(string *path,MemoryBus *memory,uint16_t start)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  ushort local_240;
  byte local_23d [5];
  uint16_t index;
  uint8_t data;
  istream local_230 [8];
  ifstream file;
  uint16_t start_local;
  MemoryBus *memory_local;
  string *path_local;
  
  std::ifstream::ifstream(local_230,(string *)path,_S_bin);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    path_local._7_1_ = false;
  }
  else {
    std::istream::operator>>(local_230,std::noskipws);
    if (start == 0) {
      local_240 = 0;
    }
    else {
      local_240 = start - 1;
    }
    while( true ) {
      piVar3 = std::operator>>(local_230,local_23d);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      local_240 = local_240 + 1;
      (*memory->_vptr_MemoryBus[3])(memory,(ulong)local_240,(ulong)local_23d[0]);
    }
    path_local._7_1_ = true;
  }
  std::ifstream::~ifstream(local_230);
  return path_local._7_1_;
}

Assistant:

inline bool ReadFile(const std::string& path, MemoryBus& memory, uint16_t start = 0)
{
    std::ifstream file(path, std::ios::binary);

    if(file.is_open())
    {
        file >> std::noskipws;
        
        uint8_t data;
        uint16_t index = start > 0 ? start - 1 : 0;
        
        while(file >> data)
            memory.Write(++index, data);
        
        return true;
    }
    
    return false;
}